

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.hpp
# Opt level: O3

Uint32 __thiscall Diligent::QueryVkImpl::GetQueryPoolIndex(QueryVkImpl *this,Uint32 QueryId)

{
  char (*in_RCX) [67];
  string msg;
  string local_38;
  
  if ((QueryId != 0) &&
     ((QueryId != 1 ||
      ((this->super_QueryBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
       .m_Desc.Type != QUERY_TYPE_DURATION)))) {
    FormatString<char[26],char[67]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"QueryId == 0 || m_Desc.Type == QUERY_TYPE_DURATION && QueryId == 1",
               in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetQueryPoolIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/QueryVkImpl.hpp"
               ,0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return *(Uint32 *)
          (&(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44 + (ulong)QueryId * 4);
}

Assistant:

Uint32 GetQueryPoolIndex(Uint32 QueryId) const
    {
        VERIFY_EXPR(QueryId == 0 || m_Desc.Type == QUERY_TYPE_DURATION && QueryId == 1);
        return m_QueryPoolIndex[QueryId];
    }